

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

string * __thiscall
t_lua_generator::lua_includes_abi_cxx11_(string *__return_storage_ptr__,t_lua_generator *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (this->gen_requires_ == true) {
    pcVar2 = "\n\nrequire \'Thrift\'";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string t_lua_generator::lua_includes() {
  if (gen_requires_) {
    return "\n\nrequire 'Thrift'";
  } else {
    return "";
  }
}